

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

boolean resists_magm(monst *mon)

{
  permonst *ptr;
  obj *otmp;
  boolean bVar1;
  obj **ppoVar2;
  boolean bVar3;
  
  ptr = mon->data;
  bVar1 = dmgtype(ptr,1);
  bVar3 = '\x01';
  if ((ptr != mons + 0x89 && bVar1 == '\0') && (bVar1 = dmgtype(ptr,0xf2), bVar1 == '\0')) {
    if (mon == &youmonst) {
      ppoVar2 = &uwep;
    }
    else {
      ppoVar2 = &mon->mw;
    }
    otmp = *ppoVar2;
    if (((otmp == (obj *)0x0) || (otmp->oartifact == '\0')) ||
       (bVar1 = defends(1,otmp), bVar1 == '\0')) {
      if (mon == &youmonst) {
        ppoVar2 = &invent;
      }
      else {
        ppoVar2 = &mon->minvent;
      }
      while (ppoVar2 = &((obj *)ppoVar2)->nobj->nobj, (obj *)ppoVar2 != (obj *)0x0) {
        if ((((obj *)ppoVar2)->owornmask != 0) && (objects[((obj *)ppoVar2)->otyp].oc_oprop == ','))
        {
          return '\x01';
        }
        if ((((obj *)ppoVar2)->oartifact != '\0') &&
           (bVar1 = protects(1,(obj *)ppoVar2), bVar1 != '\0')) {
          return '\x01';
        }
      }
      bVar3 = '\0';
    }
  }
  return bVar3;
}

Assistant:

boolean resists_magm(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	struct obj *o;

	/* as of 3.2.0:  gray dragons, Angels, Oracle, Yeenoghu */
	if (dmgtype(ptr, AD_MAGM) || ptr == &mons[PM_BABY_GRAY_DRAGON] ||
		dmgtype(ptr, AD_RBRE))	/* Chromatic Dragon */
	    return TRUE;
	/* check for magic resistance granted by wielded weapon */
	o = (mon == &youmonst) ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_MAGM, o))
	    return TRUE;
	/* check for magic resistance granted by worn or carried items */
	o = (mon == &youmonst) ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if ((o->owornmask && objects[o->otyp].oc_oprop == ANTIMAGIC) ||
		    (o->oartifact && protects(AD_MAGM, o)))
		return TRUE;
	return FALSE;
}